

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariableStackFrame.cpp
# Opt level: O2

void __thiscall Jinx::Impl::VariableStackFrame::VariableStackFrame(VariableStackFrame *this)

{
  (this->m_staticArena).m_ptr = (char *)this;
  (this->m_frames).
  super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
  ._M_impl.super__Tp_alloc_type.m_arena = &this->m_staticArena;
  (this->m_frames).
  super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_frames).
  super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_frames).
  super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_errorMessage)._M_dataplus.super_allocator_type.m_arena = &this->m_staticArena;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  (this->m_errorMessage)._M_string_length = 0;
  (this->m_errorMessage).field_2._M_local_buf[0] = '\0';
  std::
  vector<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
  ::emplace_back<>(&this->m_frames);
  std::
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
  ::emplace_back<>(&(this->m_frames).
                    super__Vector_base<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].stack);
  return;
}

Assistant:

inline_t VariableStackFrame::VariableStackFrame()
	{
		m_frames.emplace_back();
		m_frames.back().stack.emplace_back();
	}